

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

int __thiscall UnifiedRegex::CharBitvec::NextSet(CharBitvec *this,int k)

{
  uint local_28;
  uint local_24;
  uint32 v;
  uint o;
  uint w;
  int k_local;
  CharBitvec *this_local;
  
  if ((-1 < k) && (k < 0x100)) {
    v = k / 0x20;
    local_24 = k % 0x20;
    local_28 = this->vec[v] >> ((byte)local_24 & 0x1f);
    o = k;
    do {
      if (local_28 == 0) {
        o = (0x20 - local_24) + o;
        break;
      }
      if ((local_28 & 1) != 0) {
        return o;
      }
      local_28 = local_28 >> 1;
      local_24 = local_24 + 1;
      o = o + 1;
    } while (local_24 < 0x20);
LAB_01508c95:
    v = v + 1;
    if (v < 8) {
      local_24 = 0;
      local_28 = this->vec[v];
      do {
        if (local_28 == 0) {
          o = (0x20 - local_24) + o;
          break;
        }
        if ((local_28 & 1) != 0) {
          return o;
        }
        local_28 = local_28 >> 1;
        local_24 = local_24 + 1;
        o = o + 1;
      } while (local_24 < 0x20);
      goto LAB_01508c95;
    }
  }
  return -1;
}

Assistant:

int CharBitvec::NextSet(int k) const
    {
        if (k < 0 || k >= Size)
            return -1;
        uint w = k / wordSize;
        uint o = k % wordSize;
        uint32 v = vec[w] >> o;
        do
        {
            if (v == 0)
            {
                k += wordSize - o;
                break;
            }
            else if ((v & 0x1) != 0)
                return k;
            else
            {
                v >>= 1;
                o++;
                k++;
            }
        }
        while (o < wordSize);

        w++;
        while (w < vecSize)
        {
            o = 0;
            v = vec[w];
            do
            {
                if (v == 0)
                {
                    k += wordSize - o;
                    break;
                }
                else if ((v & 0x1) != 0)
                    return k;
                else
                {
                    v >>= 1;
                    o++;
                    k++;
                }

            }
            while (o < wordSize);
            w++;
        }
        return -1;
    }